

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O1

string * fs_get_homedir_abi_cxx11_(void)

{
  _Bool _Var1;
  char *pcVar2;
  size_t sVar3;
  string *in_RDI;
  string_view name;
  string_view in;
  string home;
  string local_30;
  
  _Var1 = fs_is_windows();
  pcVar2 = "HOME";
  if (_Var1) {
    pcVar2 = "USERPROFILE";
  }
  sVar3 = 4;
  if (_Var1) {
    sVar3 = 0xb;
  }
  name._M_str = pcVar2;
  name._M_len = sVar3;
  fs_getenv_abi_cxx11_(&local_30,name);
  if (local_30._M_string_length == 0) {
    fs_get_profile_dir_abi_cxx11_();
  }
  else {
    in._M_str = local_30._M_dataplus._M_p;
    in._M_len = local_30._M_string_length;
    fs_drop_slash_abi_cxx11_(in_RDI,in);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string fs_get_homedir()
{
  // has no trailing slash
  std::string home = fs_getenv(fs_is_windows() ? "USERPROFILE" : "HOME");

  return home.empty() ? fs_get_profile_dir() : fs_drop_slash(home);
}